

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O0

string * __thiscall rtosc::MidiMappernRT::getMappedString(MidiMappernRT *this,string *addr)

{
  bool bVar1;
  int iVar2;
  __tuple_element_t<1UL,_tuple<int,_int,_int,_MidiBijection>_> *p_Var3;
  key_type *__k;
  __tuple_element_t<2UL,_tuple<int,_int,_int,_MidiBijection>_> *p_Var4;
  ostream *this_00;
  long in_RSI;
  string *in_RDI;
  stringstream out;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
  *in_stack_fffffffffffffd00;
  key_type *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 uVar5;
  int in_stack_fffffffffffffd34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  byte in_stack_fffffffffffffd4f;
  stringstream local_1a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [12];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = has_t<std::map<std::__cxx11::string,std::tuple<int,int,int,rtosc::MidiBijection>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<int,int,int,rtosc::MidiBijection>>>>,std::__cxx11::string>
                    (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  if (bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 in_stack_fffffffffffffd28);
    p_Var3 = std::get<1ul,int,int,int,rtosc::MidiBijection>
                       ((tuple<int,_int,_int,_rtosc::MidiBijection> *)0x1292e1);
    if (*p_Var3 != -1) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   in_stack_fffffffffffffd28);
      p_Var3 = std::get<1ul,int,int,int,rtosc::MidiBijection>
                         ((tuple<int,_int,_int,_rtosc::MidiBijection> *)0x129319);
      std::ostream::operator<<((ostream *)local_190,*p_Var3);
    }
  }
  else {
    std::make_pair<std::__cxx11::string&,bool>
              (in_stack_fffffffffffffcf8,
               (bool *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    in_stack_fffffffffffffd4f =
         has2<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
                   ((deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     *)in_stack_fffffffffffffd38,
                    (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                     *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
             *)0x1293a4);
    if ((in_stack_fffffffffffffd4f & 1) != 0) {
      in_stack_fffffffffffffd38 = local_190;
      in_stack_fffffffffffffd40 =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
            *)(in_RSI + 0x30);
      std::make_pair<std::__cxx11::string&,bool>
                (in_stack_fffffffffffffcf8,
                 (bool *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
      in_stack_fffffffffffffd34 =
           getInd<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
                     ((deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                      in_stack_fffffffffffffd40);
      std::ostream::operator<<((ostream *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd34);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
             *)0x12942b);
    }
  }
  bVar1 = has_t<std::map<std::__cxx11::string,std::tuple<int,int,int,rtosc::MidiBijection>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<int,int,int,rtosc::MidiBijection>>>>,std::__cxx11::string>
                    (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd30);
  if (bVar1) {
    __k = (key_type *)
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd34,uVar5),in_stack_fffffffffffffd28);
    p_Var4 = std::get<2ul,int,int,int,rtosc::MidiBijection>
                       ((tuple<int,_int,_int,_rtosc::MidiBijection> *)0x1294c9);
    if (*p_Var4 != -1) {
      this_00 = std::operator<<((ostream *)local_190,":");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd34,uVar5),__k);
      p_Var4 = std::get<2ul,int,int,int,rtosc::MidiBijection>
                         ((tuple<int,_int,_int,_rtosc::MidiBijection> *)0x12950f);
      std::ostream::operator<<((ostream *)this_00,*p_Var4);
    }
  }
  else {
    std::make_pair<std::__cxx11::string&,bool>
              (in_stack_fffffffffffffcf8,
               (bool *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    bVar1 = has2<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
                      ((deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                        *)in_stack_fffffffffffffd38,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                        *)CONCAT44(in_stack_fffffffffffffd34,uVar5));
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
             *)0x129581);
    if (bVar1) {
      __x = local_190;
      std::make_pair<std::__cxx11::string&,bool>
                (__x,(bool *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
      iVar2 = getInd<std::deque<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>,std::pair<std::__cxx11::string,bool>>
                        ((deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                          *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                         in_stack_fffffffffffffd40);
      std::ostream::operator<<((ostream *)__x,iVar2);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
             *)0x129608);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string MidiMappernRT::getMappedString(std::string addr)
{
    std::stringstream out;
    //find coarse
    if(has_t(inv_map,addr)) {
        if(std::get<1>(inv_map[addr]) != -1)
            out << std::get<1>(inv_map[addr]);
    }else if(has2(learnQueue, make_pair(addr,true)))
        out << getInd(learnQueue,std::make_pair(addr,true));
    //find Fine
    if(has_t(inv_map,addr)) {
        if(std::get<2>(inv_map[addr]) != -1)
            out << ":" << std::get<2>(inv_map[addr]);
    } else if(has2(learnQueue, make_pair(addr,false)))
        out << getInd(learnQueue,std::make_pair(addr,false));

    return out.str();
}